

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int expand(archive_read *a,int64_t *end)

{
  byte bVar1;
  rar *rar;
  void *pvVar2;
  rar_program_code *prVar3;
  long *plVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  int64_t iVar14;
  uint8_t *puVar15;
  rar_program_code **pprVar16;
  byte *__ptr;
  rar_program_code *prog;
  undefined8 *__ptr_00;
  void *pvVar17;
  long lVar18;
  rar_program_code **pprVar19;
  long *plVar20;
  uint uVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  size_t __size;
  bool bVar25;
  byte local_119;
  archive_read *local_118;
  uint8_t flags;
  uint32_t local_10c;
  ulong local_108;
  rar_br *local_100;
  int64_t *local_f8;
  void *local_f0;
  undefined8 local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  uint32_t uStack_d8;
  uint32_t uStack_d4;
  undefined8 uStack_d0;
  long local_c8;
  rar_program_code **local_c0;
  uint8_t *local_b8;
  ulong local_b0;
  void *local_a8;
  huffman_code *local_a0;
  huffman_code *local_98;
  huffman_code *local_90;
  huffman_code *local_88;
  memory_bit_reader local_80;
  memory_bit_reader local_58;
  
  rar = (rar *)a->format->data;
  lVar18 = (rar->filters).filterstart;
  iVar14 = *end;
  if (lVar18 < *end) {
    *end = lVar18;
    iVar14 = lVar18;
  }
  local_100 = &rar->br;
  local_88 = &rar->maincode;
  local_98 = &rar->offsetcode;
  local_a0 = &rar->lowoffsetcode;
  local_90 = &rar->lengthcode;
  local_118 = a;
  local_f8 = end;
  do {
    lVar18 = (rar->lzss).position;
    if (iVar14 <= lVar18) {
      return 0;
    }
    if (rar->is_ppmd_block != '\0') {
      *end = lVar18;
      return 0;
    }
    uVar6 = read_next_symbol(a,local_88);
    if ((int)uVar6 < 0) {
      return -0x1e;
    }
    if (uVar6 < 0x100) {
      lzss_emit_literal(rar,(uint8_t)uVar6);
    }
    else if (uVar6 == 0x102) {
      uVar6 = rar->lastlength;
      if (uVar6 != 0) {
        uVar21 = rar->lastoffset;
        goto LAB_0012db1a;
      }
    }
    else {
      if (uVar6 == 0x101) {
        pvVar17 = a->format->data;
        iVar8 = rar_decode_byte(a,&flags);
        if (iVar8 == 0) {
          return -0x1e;
        }
        local_108 = (ulong)flags;
        __size = (ulong)(flags & 7) + 1;
        if (__size == 7) {
          iVar8 = rar_decode_byte(a,&local_119);
          if (iVar8 == 0) {
            return -0x1e;
          }
          __size = (ulong)local_119 + 7;
        }
        else if ((char)__size == '\b') {
          iVar8 = rar_decode_byte(a,&local_119);
          bVar5 = local_119;
          if (iVar8 == 0) {
            return -0x1e;
          }
          iVar8 = rar_decode_byte(a,&local_119);
          if (iVar8 == 0) {
            return -0x1e;
          }
          __size = (size_t)CONCAT11(bVar5,local_119);
        }
        puVar15 = (uint8_t *)malloc(__size);
        if (puVar15 == (uint8_t *)0x0) {
          return -0x1e;
        }
        sVar22 = 0;
        while (end = local_f8, __size != sVar22) {
          iVar8 = rar_decode_byte(a,puVar15 + sVar22);
          sVar22 = sVar22 + 1;
          if (iVar8 == 0) goto LAB_0012dc0a;
        }
        pvVar2 = a->format->data;
        local_80.available = 0;
        local_80.at_eof = 0;
        local_80.offset = 0;
        local_80.bits = 0;
        uStack_d8 = 0;
        uStack_d4 = 0;
        uStack_d0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        uStack_dc = 0;
        uVar6 = 0;
        local_c0 = (rar_program_code **)((long)pvVar2 + 0x398);
        for (pprVar16 = local_c0; *pprVar16 != (rar_program_code *)0x0;
            pprVar16 = &(*pprVar16)->next) {
          uVar6 = uVar6 + 1;
        }
        local_f0 = pvVar2;
        local_b8 = puVar15;
        local_a8 = pvVar17;
        local_80.bytes = puVar15;
        local_80.length = __size;
        if ((char)local_108 < '\0') {
          uVar12 = membr_next_rarvm_number(&local_80);
          if (uVar12 == 0) {
            delete_filter(*(rar_filter **)((long)pvVar2 + 0x3a0));
            *(undefined8 *)((long)pvVar2 + 0x3a0) = 0;
            delete_program_code(*(rar_program_code **)((long)pvVar2 + 0x398));
            *(undefined8 *)((long)pvVar2 + 0x398) = 0;
            uVar21 = 0;
          }
          else {
            uVar21 = uVar12 - 1;
            puVar15 = local_b8;
            if (uVar6 < uVar21) goto LAB_0012dc0a;
          }
          *(uint *)((long)local_f0 + 0x3b0) = uVar21;
        }
        else {
          uVar21 = *(uint *)((long)pvVar2 + 0x3b0);
        }
        pvVar17 = local_f0;
        pprVar16 = local_c0;
        while( true ) {
          prog = *pprVar16;
          bVar25 = uVar21 == 0;
          uVar21 = uVar21 - 1;
          if (bVar25) break;
          pprVar16 = &prog->next;
        }
        if (prog != (rar_program_code *)0x0) {
          prog->usagecount = prog->usagecount + 1;
        }
        uVar12 = membr_next_rarvm_number(&local_80);
        local_c8 = *(long *)((long)pvVar17 + 0x360) + 0x102;
        if ((local_108 & 0x40) == 0) {
          local_c8 = *(long *)((long)pvVar17 + 0x360);
        }
        local_c8 = local_c8 + (ulong)uVar12;
        if ((local_108 & 0x20) == 0) {
          if (prog == (rar_program_code *)0x0) {
            uStack_d8 = 0;
            goto LAB_0012d6cf;
          }
          uStack_d8 = prog->oldfilterlength;
LAB_0012d6b8:
          uStack_d4 = prog->usagecount;
        }
        else {
          uStack_d8 = membr_next_rarvm_number(&local_80);
          if (prog != (rar_program_code *)0x0) goto LAB_0012d6b8;
LAB_0012d6cf:
          uStack_d4 = 0;
        }
        uStack_dc = 0x3c000;
        uStack_d0 = CONCAT44(0x40000,(undefined4)uStack_d0);
        local_10c = uStack_d8;
        if ((local_108 & 0x10) != 0) {
          uVar12 = membr_bits(&local_80,7);
          for (lVar18 = 0; lVar18 != 7; lVar18 = lVar18 + 1) {
            if ((uVar12 >> ((uint)lVar18 & 0x1f) & 1) != 0) {
              uVar13 = membr_next_rarvm_number(&local_80);
              *(uint32_t *)((long)&local_e8 + lVar18 * 4) = uVar13;
            }
          }
        }
        a = local_118;
        if (prog == (rar_program_code *)0x0) {
          uVar12 = membr_next_rarvm_number(&local_80);
          uVar24 = (ulong)uVar12;
          puVar15 = local_b8;
          if ((uVar12 - 0x10001 < 0xffff0000) ||
             (__ptr = (byte *)malloc(uVar24), puVar15 = local_b8, __ptr == (byte *)0x0))
          goto LAB_0012dc0a;
          for (uVar23 = 0; end = local_f8, uVar24 != uVar23; uVar23 = uVar23 + 1) {
            uVar13 = membr_bits(&local_80,8);
            __ptr[uVar23] = (byte)uVar13;
          }
          local_58.bits = 0;
          local_58.available = 0;
          local_58.at_eof = 0;
          bVar5 = 0;
          for (uVar23 = 1; uVar24 != uVar23; uVar23 = uVar23 + 1) {
            bVar5 = bVar5 ^ __ptr[uVar23];
          }
          local_b0 = uVar24;
          if ((uVar12 != 0) && (bVar5 == *__ptr)) {
            local_58.offset = 1;
            local_58.bytes = __ptr;
            local_58.length = uVar24;
            prog = (rar_program_code *)calloc(1,0x38);
            if (prog != (rar_program_code *)0x0) {
              uVar23 = crc32(0,__ptr,local_b0);
              prog->fingerprint = uVar24 << 0x20 | uVar23;
              uVar12 = membr_bits(&local_58,1);
              if (uVar12 != 0) {
                uVar12 = membr_next_rarvm_number(&local_58);
                uVar6 = uVar12 + 1;
                prog->staticdatalen = uVar6;
                puVar15 = (uint8_t *)malloc((ulong)uVar6);
                prog->staticdata = puVar15;
                if (puVar15 == (uint8_t *)0x0) {
                  delete_program_code(prog);
                  goto LAB_0012dbfd;
                }
                for (uVar24 = 0; end = local_f8, a = local_118, uVar6 != uVar24; uVar24 = uVar24 + 1
                    ) {
                  uVar12 = membr_bits(&local_58,8);
                  puVar15[uVar24] = (uint8_t)uVar12;
                }
              }
              free(__ptr);
              pprVar16 = local_c0;
              do {
                pprVar19 = pprVar16;
                prVar3 = *pprVar19;
                pprVar16 = &prVar3->next;
              } while (prVar3 != (rar_program_code *)0x0);
              *pprVar19 = prog;
              goto LAB_0012d890;
            }
          }
        }
        else {
LAB_0012d890:
          prog->oldfilterlength = local_10c;
          if ((local_108 & 8) == 0) {
            local_108 = 0;
            __ptr = (byte *)0x0;
          }
          else {
            uVar12 = membr_next_rarvm_number(&local_80);
            puVar15 = local_b8;
            if (0x1fc0 < uVar12) goto LAB_0012dc0a;
            __ptr = (byte *)malloc((ulong)(uVar12 + 0x40));
            puVar15 = local_b8;
            if (__ptr == (byte *)0x0) goto LAB_0012dc0a;
            local_108 = (ulong)uVar12;
            for (uVar24 = 0; end = local_f8, a = local_118, uVar12 != uVar24; uVar24 = uVar24 + 1) {
              uVar13 = membr_bits(&local_80,8);
              __ptr[uVar24 + 0x40] = (byte)uVar13;
            }
          }
          if (local_80.at_eof == 0) {
            __ptr_00 = (undefined8 *)calloc(1,0x58);
            if (__ptr_00 == (undefined8 *)0x0) {
LAB_0012d99d:
              __ptr_00 = (undefined8 *)0x0;
            }
            else {
              *__ptr_00 = prog;
              uVar24 = 0x40;
              if (0x40 < (uint)local_108) {
                uVar24 = local_108;
              }
              *(int *)(__ptr_00 + 6) = (int)uVar24;
              pvVar17 = calloc(1,uVar24 & 0xffffffff);
              __ptr_00[5] = pvVar17;
              if (pvVar17 == (void *)0x0) {
                free(__ptr_00);
                goto LAB_0012d99d;
              }
              if (__ptr != (byte *)0x0) {
                memcpy(pvVar17,__ptr,local_108 & 0xffffffff);
              }
              __ptr_00[3] = CONCAT44(uStack_d4,uStack_d8);
              __ptr_00[4] = uStack_d0;
              __ptr_00[1] = local_e8;
              __ptr_00[2] = CONCAT44(uStack_dc,uStack_e0);
              __ptr_00[7] = local_c8;
              *(uint32_t *)(__ptr_00 + 8) = local_10c;
            }
            free(__ptr);
            pvVar17 = local_a8;
            puVar15 = local_b8;
            if (__ptr_00 == (undefined8 *)0x0) goto LAB_0012dc0a;
            for (lVar18 = 0; lVar18 != 7; lVar18 = lVar18 + 1) {
              *(undefined4 *)(__ptr_00[5] + lVar18 * 4) =
                   *(undefined4 *)((long)&local_e8 + lVar18 * 4);
            }
            *(uint32_t *)(__ptr_00[5] + 0x1c) = local_10c;
            *(undefined4 *)(__ptr_00[5] + 0x20) = 0;
            *(uint32_t *)(__ptr_00[5] + 0x2c) = prog->usagecount;
            plVar4 = (long *)((long)local_f0 + 0x3a0);
            do {
              plVar20 = plVar4;
              lVar18 = *plVar20;
              plVar4 = (long *)(lVar18 + 0x50);
            } while (lVar18 != 0);
            *plVar20 = (long)__ptr_00;
            if (*(long *)(*(long *)((long)local_f0 + 0x3a0) + 0x50) == 0) {
              *(long *)((long)local_f0 + 0x3a8) = local_c8;
            }
            free(local_b8);
            if (*(long *)((long)pvVar17 + 0x3a8) < *end) {
              *end = *(long *)((long)pvVar17 + 0x3a8);
            }
            goto LAB_0012db3a;
          }
        }
LAB_0012dbfd:
        free(__ptr);
        puVar15 = local_b8;
LAB_0012dc0a:
        free(puVar15);
        return -0x1e;
      }
      if (uVar6 == 0x100) {
        iVar8 = (rar->br).cache_avail;
        if (iVar8 < 1) {
          iVar7 = rar_br_fillup(local_118,local_100);
          iVar8 = (rar->br).cache_avail;
          if (iVar8 < 1 && iVar7 == 0) goto LAB_0012dbd5;
        }
        a = local_118;
        uVar6 = iVar8 - 1;
        (rar->br).cache_avail = uVar6;
        if (((rar->br).cache_buffer >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
          rar->start_new_block = '\x01';
          if (iVar8 < 2) {
            iVar8 = rar_br_fillup(local_118,local_100);
            uVar6 = (rar->br).cache_avail;
            if ((int)uVar6 < 1 && iVar8 == 0) goto LAB_0012dbd5;
          }
          rar->start_new_table = ((rar->br).cache_buffer >> ((ulong)(uVar6 - 1) & 0x3f) & 1) != 0;
          (rar->br).cache_avail = uVar6 - 1;
          *local_f8 = (rar->lzss).position;
          return 0;
        }
        iVar8 = parse_codes(local_118);
        end = local_f8;
        if (iVar8 != 0) {
          return -0x1e;
        }
        goto LAB_0012db3a;
      }
      if (uVar6 < 0x107) {
        uVar24 = (ulong)(uVar6 - 0x103);
        uVar21 = rar->oldoffset[uVar24];
        uVar9 = read_next_symbol(a,local_90);
        if (0x1b < uVar9) goto LAB_0012db58;
        uVar6 = ""[uVar9] + 2;
        if (7 < uVar9) {
          bVar5 = ""[uVar9];
          iVar8 = (rar->br).cache_avail;
          if (iVar8 < (int)(uint)bVar5) {
            iVar7 = rar_br_fillup(local_118,local_100);
            iVar8 = (rar->br).cache_avail;
            if ((iVar7 == 0) && (iVar8 < (int)(uint)bVar5)) goto LAB_0012dbd5;
          }
          iVar8 = iVar8 - (uint)bVar5;
          uVar6 = ((uint)((rar->br).cache_buffer >> ((byte)iVar8 & 0x3f)) & cache_masks[bVar5]) +
                  uVar6;
          (rar->br).cache_avail = iVar8;
          a = local_118;
        }
        for (; 0 < (int)uVar24; uVar24 = uVar24 - 1) {
          rar->oldoffset[uVar24] = rar->oldoffset[uVar24 - 1];
        }
      }
      else {
        if (uVar6 < 0x10f) {
          bVar5 = ""[uVar6 - 0x107];
          bVar1 = "\x02\x02\x03\x04\x05\x06\x06\x06"[uVar6 - 0x107];
          iVar8 = (rar->br).cache_avail;
          if (iVar8 < (int)(uint)bVar1) {
            iVar7 = rar_br_fillup(local_118,local_100);
            iVar8 = (rar->br).cache_avail;
            if ((iVar7 == 0) && (iVar8 < (int)(uint)bVar1)) goto LAB_0012dbd5;
          }
          uVar24 = (rar->br).cache_buffer;
          iVar8 = iVar8 - (uint)bVar1;
          uVar6 = cache_masks[bVar1];
          (rar->br).cache_avail = iVar8;
          for (lVar18 = 0; lVar18 != -3; lVar18 = lVar18 + -1) {
            rar->oldoffset[lVar18 + 3] = rar->oldoffset[lVar18 + 2];
          }
          uVar21 = bVar5 + 1 + ((uint)(uVar24 >> ((byte)iVar8 & 0x3f)) & uVar6);
          rar->oldoffset[0] = uVar21;
          uVar6 = 2;
          a = local_118;
          goto LAB_0012db1a;
        }
        if (0x12a < uVar6) {
LAB_0012db58:
          archive_set_error(&a->archive,0x54,"Bad RAR file data");
          return -0x1e;
        }
        uVar6 = uVar6 - 0x10f;
        iVar8 = ""[uVar6] + 3;
        if (7 < uVar6) {
          bVar5 = ""[uVar6];
          iVar7 = (rar->br).cache_avail;
          if (iVar7 < (int)(uint)bVar5) {
            iVar10 = rar_br_fillup(local_118,local_100);
            iVar7 = (rar->br).cache_avail;
            if ((iVar10 == 0) && (iVar7 < (int)(uint)bVar5)) goto LAB_0012dbd5;
          }
          iVar7 = iVar7 - (uint)bVar5;
          iVar8 = ((uint)((rar->br).cache_buffer >> ((byte)iVar7 & 0x3f)) & cache_masks[bVar5]) +
                  iVar8;
          (rar->br).cache_avail = iVar7;
          a = local_118;
        }
        uVar6 = read_next_symbol(a,local_98);
        if (0x3b < uVar6) goto LAB_0012db58;
        uVar24 = (ulong)uVar6;
        uVar21 = expand::offsetbases[uVar24] + 1;
        if (3 < uVar6) {
          bVar5 = ""[uVar24];
          if (uVar6 < 10) {
            iVar7 = (rar->br).cache_avail;
            if (iVar7 < (int)(uint)bVar5) {
              iVar10 = rar_br_fillup(local_118,local_100);
              iVar7 = (rar->br).cache_avail;
              if ((iVar10 == 0) && (iVar7 < (int)(uint)bVar5)) {
LAB_0012dbd5:
                archive_set_error(&local_118->archive,0x54,"Truncated RAR file data");
                rar->valid = '\0';
                return -0x1e;
              }
            }
            iVar7 = iVar7 - (uint)bVar5;
            uVar21 = ((uint)((rar->br).cache_buffer >> ((byte)iVar7 & 0x3f)) & cache_masks[bVar5]) +
                     uVar21;
            (rar->br).cache_avail = iVar7;
            a = local_118;
          }
          else {
            if (uVar24 - 0xc < 0x30) {
              iVar7 = (rar->br).cache_avail;
              iVar10 = bVar5 - 4;
              if (iVar7 < iVar10) {
                iVar11 = rar_br_fillup(local_118,local_100);
                iVar7 = (rar->br).cache_avail;
                if ((iVar11 == 0) && (iVar7 < iVar10)) goto LAB_0012dbd5;
              }
              uVar21 = ((uint)((rar->br).cache_buffer >> ((byte)(iVar7 - iVar10) & 0x3f)) &
                       *(uint *)("" + (ulong)bVar5 * 4)) * 0x10 + uVar21;
              (rar->br).cache_avail = iVar7 - iVar10;
            }
            a = local_118;
            if (rar->numlowoffsetrepeats == 0) {
              uVar6 = read_next_symbol(local_118,local_a0);
              if ((int)uVar6 < 0) {
                return -0x1e;
              }
              if (uVar6 != 0x10) {
                uVar21 = uVar21 + uVar6;
                rar->lastlowoffset = uVar6;
                goto LAB_0012dada;
              }
              rar->numlowoffsetrepeats = 0xf;
            }
            else {
              rar->numlowoffsetrepeats = rar->numlowoffsetrepeats - 1;
            }
            uVar21 = uVar21 + rar->lastlowoffset;
          }
        }
LAB_0012dada:
        for (lVar18 = 0; lVar18 != -3; lVar18 = lVar18 + -1) {
          rar->oldoffset[lVar18 + 3] = rar->oldoffset[lVar18 + 2];
        }
        uVar6 = iVar8 + (uint)(0x3ffff < (int)uVar21) + (uint)(0x1fff < (int)uVar21);
      }
      rar->oldoffset[0] = uVar21;
LAB_0012db1a:
      rar->lastoffset = uVar21;
      rar->lastlength = uVar6;
      lzss_emit_match(rar,uVar21,uVar6);
      end = local_f8;
    }
LAB_0012db3a:
    iVar14 = *end;
  } while( true );
}

Assistant:

static int
expand(struct archive_read *a, int64_t *end)
{
  static const unsigned char lengthbases[] =
    {   0,   1,   2,   3,   4,   5,   6,
        7,   8,  10,  12,  14,  16,  20,
       24,  28,  32,  40,  48,  56,  64,
       80,  96, 112, 128, 160, 192, 224 };
  static const unsigned char lengthbits[] =
    { 0, 0, 0, 0, 0, 0, 0,
      0, 1, 1, 1, 1, 2, 2,
      2, 2, 3, 3, 3, 3, 4,
      4, 4, 4, 5, 5, 5, 5 };
  static const int lengthb_min = minimum(
    (int)(sizeof(lengthbases)/sizeof(lengthbases[0])),
    (int)(sizeof(lengthbits)/sizeof(lengthbits[0]))
  );
  static const unsigned int offsetbases[] =
    {       0,       1,       2,       3,       4,       6,
            8,      12,      16,      24,      32,      48,
           64,      96,     128,     192,     256,     384,
          512,     768,    1024,    1536,    2048,    3072,
         4096,    6144,    8192,   12288,   16384,   24576,
        32768,   49152,   65536,   98304,  131072,  196608,
       262144,  327680,  393216,  458752,  524288,  589824,
       655360,  720896,  786432,  851968,  917504,  983040,
      1048576, 1310720, 1572864, 1835008, 2097152, 2359296,
      2621440, 2883584, 3145728, 3407872, 3670016, 3932160 };
  static const unsigned char offsetbits[] =
    {  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,
       5,  5,  6,  6,  7,  7,  8,  8,  9,  9, 10, 10,
      11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
      18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18 };
  static const int offsetb_min = minimum(
    (int)(sizeof(offsetbases)/sizeof(offsetbases[0])),
    (int)(sizeof(offsetbits)/sizeof(offsetbits[0]))
  );
  static const unsigned char shortbases[] =
    { 0, 4, 8, 16, 32, 64, 128, 192 };
  static const unsigned char shortbits[] =
    { 2, 2, 3, 4, 5, 6, 6, 6 };

  int symbol, offs, len, offsindex, lensymbol, i, offssymbol, lowoffsetsymbol;
  unsigned char newfile;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  if (rar->filters.filterstart < *end)
    *end = rar->filters.filterstart;

  while (1)
  {
    if(lzss_position(&rar->lzss) >= *end) {
      return (ARCHIVE_OK);
    }

    if(rar->is_ppmd_block) {
      *end = lzss_position(&rar->lzss);
      return (ARCHIVE_OK);
    }

    if ((symbol = read_next_symbol(a, &rar->maincode)) < 0)
      return (ARCHIVE_FATAL);

    if (symbol < 256)
    {
      lzss_emit_literal(rar, (uint8_t)symbol);
      continue;
    }
    else if (symbol == 256)
    {
      if (!rar_br_read_ahead(a, br, 1))
        goto truncated_data;
      newfile = !rar_br_bits(br, 1);
      rar_br_consume(br, 1);

      if(newfile)
      {
        rar->start_new_block = 1;
        if (!rar_br_read_ahead(a, br, 1))
          goto truncated_data;
        rar->start_new_table = rar_br_bits(br, 1);
        rar_br_consume(br, 1);
        *end = lzss_position(&rar->lzss);
        return (ARCHIVE_OK);
      }
      else
      {
        if (parse_codes(a) != ARCHIVE_OK)
          return (ARCHIVE_FATAL);
        continue;
      }
    }
    else if(symbol==257)
    {
      if (!read_filter(a, end))
          return (ARCHIVE_FATAL);
      continue;
    }
    else if(symbol==258)
    {
      if(rar->lastlength == 0)
        continue;

      offs = rar->lastoffset;
      len = rar->lastlength;
    }
    else if (symbol <= 262)
    {
      offsindex = symbol - 259;
      offs = rar->oldoffset[offsindex];

      if ((lensymbol = read_next_symbol(a, &rar->lengthcode)) < 0)
        goto bad_data;
      if (lensymbol >= lengthb_min)
        goto bad_data;
      len = lengthbases[lensymbol] + 2;
      if (lengthbits[lensymbol] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[lensymbol]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[lensymbol]);
        rar_br_consume(br, lengthbits[lensymbol]);
      }

      for (i = offsindex; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else if(symbol<=270)
    {
      offs = shortbases[symbol-263] + 1;
      if(shortbits[symbol-263] > 0) {
        if (!rar_br_read_ahead(a, br, shortbits[symbol-263]))
          goto truncated_data;
        offs += rar_br_bits(br, shortbits[symbol-263]);
        rar_br_consume(br, shortbits[symbol-263]);
      }

      len = 2;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else
    {
      if (symbol-271 >= lengthb_min)
        goto bad_data;
      len = lengthbases[symbol-271]+3;
      if(lengthbits[symbol-271] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[symbol-271]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[symbol-271]);
        rar_br_consume(br, lengthbits[symbol-271]);
      }

      if ((offssymbol = read_next_symbol(a, &rar->offsetcode)) < 0)
        goto bad_data;
      if (offssymbol >= offsetb_min)
        goto bad_data;
      offs = offsetbases[offssymbol]+1;
      if(offsetbits[offssymbol] > 0)
      {
        if(offssymbol > 9)
        {
          if(offsetbits[offssymbol] > 4) {
            if (!rar_br_read_ahead(a, br, offsetbits[offssymbol] - 4))
              goto truncated_data;
            offs += rar_br_bits(br, offsetbits[offssymbol] - 4) << 4;
            rar_br_consume(br, offsetbits[offssymbol] - 4);
          }

          if(rar->numlowoffsetrepeats > 0)
          {
            rar->numlowoffsetrepeats--;
            offs += rar->lastlowoffset;
          }
          else
          {
            if ((lowoffsetsymbol =
              read_next_symbol(a, &rar->lowoffsetcode)) < 0)
              return (ARCHIVE_FATAL);
            if(lowoffsetsymbol == 16)
            {
              rar->numlowoffsetrepeats = 15;
              offs += rar->lastlowoffset;
            }
            else
            {
              offs += lowoffsetsymbol;
              rar->lastlowoffset = lowoffsetsymbol;
            }
          }
        }
        else {
          if (!rar_br_read_ahead(a, br, offsetbits[offssymbol]))
            goto truncated_data;
          offs += rar_br_bits(br, offsetbits[offssymbol]);
          rar_br_consume(br, offsetbits[offssymbol]);
        }
      }

      if (offs >= 0x40000)
        len++;
      if (offs >= 0x2000)
        len++;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }

    rar->lastoffset = offs;
    rar->lastlength = len;

    lzss_emit_match(rar, rar->lastoffset, rar->lastlength);
  }
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
bad_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}